

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O1

void aom_paeth_predictor_64x32_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  ushort uVar42;
  undefined1 auVar43 [15];
  ushort uVar44;
  undefined1 auVar45 [15];
  ushort uVar46;
  undefined1 auVar47 [15];
  ushort uVar48;
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [15];
  unkuint9 Var70;
  undefined1 auVar71 [11];
  undefined1 auVar72 [15];
  unkuint9 Var73;
  undefined1 auVar74 [11];
  undefined1 auVar75 [15];
  unkuint9 Var76;
  undefined1 auVar77 [11];
  undefined1 auVar78 [13];
  undefined1 auVar79 [15];
  unkuint9 Var80;
  undefined1 auVar81 [11];
  undefined1 auVar82 [15];
  undefined1 auVar83 [15];
  undefined1 auVar84 [15];
  undefined1 auVar85 [15];
  undefined1 auVar86 [15];
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [15];
  undefined1 auVar90 [16];
  long lVar91;
  int iVar92;
  bool bVar93;
  undefined1 auVar94 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar107 [16];
  undefined1 auVar115 [16];
  short sVar123;
  undefined4 uVar124;
  short sVar129;
  short sVar131;
  short sVar132;
  short sVar133;
  short sVar134;
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  short sVar128;
  short sVar135;
  undefined1 auVar127 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  short sVar162;
  short sVar163;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  short sVar176;
  short sVar178;
  short sVar179;
  short sVar180;
  short sVar181;
  short sVar182;
  short sVar183;
  undefined1 auVar177 [16];
  short sVar184;
  undefined1 in_XMM12 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  short local_d8;
  short sStack_d6;
  short sStack_d4;
  short sStack_d2;
  short sStack_d0;
  short sStack_ce;
  short sStack_cc;
  short sStack_ca;
  short local_b8;
  short sStack_b6;
  short sStack_b4;
  short sStack_b2;
  short sStack_b0;
  short sStack_ae;
  short sStack_ac;
  short sStack_aa;
  short local_98;
  short sStack_96;
  short sStack_94;
  short sStack_92;
  short sStack_90;
  short sStack_8e;
  short sStack_8c;
  short sStack_8a;
  byte bVar95;
  byte bVar96;
  byte bVar97;
  byte bVar98;
  byte bVar99;
  byte bVar100;
  byte bVar101;
  short sVar106;
  byte bVar108;
  byte bVar109;
  byte bVar110;
  byte bVar111;
  byte bVar112;
  byte bVar113;
  byte bVar114;
  byte bVar116;
  byte bVar117;
  byte bVar118;
  byte bVar119;
  byte bVar120;
  byte bVar121;
  byte bVar122;
  short sVar130;
  short sVar142;
  short sVar172;
  byte bVar202;
  byte bVar203;
  byte bVar204;
  byte bVar205;
  byte bVar206;
  byte bVar207;
  byte bVar208;
  
  auVar125 = *(undefined1 (*) [16])above;
  auVar102 = *(undefined1 (*) [16])(above + 0x10);
  auVar103 = *(undefined1 (*) [16])(above + 0x20);
  auVar104 = *(undefined1 (*) [16])(above + 0x30);
  auVar38[0xd] = 0;
  auVar38._0_13_ = auVar125._0_13_;
  auVar38[0xe] = auVar125[7];
  uVar42 = auVar38._13_2_;
  auVar43[0xc] = auVar125[6];
  auVar43._0_12_ = auVar125._0_12_;
  auVar43._13_2_ = uVar42;
  auVar50[0xb] = 0;
  auVar50._0_11_ = auVar125._0_11_;
  auVar50._12_3_ = auVar43._12_3_;
  auVar54[10] = auVar125[5];
  auVar54._0_10_ = auVar125._0_10_;
  auVar54._11_4_ = auVar50._11_4_;
  auVar58[9] = 0;
  auVar58._0_9_ = auVar125._0_9_;
  auVar58._10_5_ = auVar54._10_5_;
  auVar62[8] = auVar125[4];
  auVar62._0_8_ = auVar125._0_8_;
  auVar62._9_6_ = auVar58._9_6_;
  auVar69._7_8_ = 0;
  auVar69._0_7_ = auVar62._8_7_;
  Var70 = CONCAT81(SUB158(auVar69 << 0x40,7),auVar125[3]);
  auVar82._9_6_ = 0;
  auVar82._0_9_ = Var70;
  auVar71._1_10_ = SUB1510(auVar82 << 0x30,5);
  auVar71[0] = auVar125[2];
  auVar83._11_4_ = 0;
  auVar83._0_11_ = auVar71;
  auVar66[2] = auVar125[1];
  auVar66._0_2_ = auVar125._0_2_;
  auVar66._3_12_ = SUB1512(auVar83 << 0x20,3);
  auVar143._0_2_ = auVar125._0_2_ & 0xff;
  auVar143._2_13_ = auVar66._2_13_;
  auVar143[0xf] = 0;
  auVar94._0_2_ = CONCAT11(0,auVar125[8]);
  bVar95 = auVar125[9];
  auVar94[2] = bVar95;
  auVar94[3] = 0;
  bVar96 = auVar125[10];
  auVar94[4] = bVar96;
  auVar94[5] = 0;
  bVar97 = auVar125[0xb];
  auVar94[6] = bVar97;
  auVar94[7] = 0;
  bVar98 = auVar125[0xc];
  auVar94[8] = bVar98;
  auVar94[9] = 0;
  bVar99 = auVar125[0xd];
  auVar94[10] = bVar99;
  auVar94[0xb] = 0;
  bVar100 = auVar125[0xe];
  auVar94[0xc] = bVar100;
  auVar94[0xd] = 0;
  bVar101 = auVar125[0xf];
  auVar94[0xe] = bVar101;
  auVar94[0xf] = 0;
  auVar39[0xd] = 0;
  auVar39._0_13_ = auVar102._0_13_;
  auVar39[0xe] = auVar102[7];
  uVar44 = auVar39._13_2_;
  auVar45[0xc] = auVar102[6];
  auVar45._0_12_ = auVar102._0_12_;
  auVar45._13_2_ = uVar44;
  auVar51[0xb] = 0;
  auVar51._0_11_ = auVar102._0_11_;
  auVar51._12_3_ = auVar45._12_3_;
  auVar55[10] = auVar102[5];
  auVar55._0_10_ = auVar102._0_10_;
  auVar55._11_4_ = auVar51._11_4_;
  auVar59[9] = 0;
  auVar59._0_9_ = auVar102._0_9_;
  auVar59._10_5_ = auVar55._10_5_;
  auVar63[8] = auVar102[4];
  auVar63._0_8_ = auVar102._0_8_;
  auVar63._9_6_ = auVar59._9_6_;
  auVar72._7_8_ = 0;
  auVar72._0_7_ = auVar63._8_7_;
  Var73 = CONCAT81(SUB158(auVar72 << 0x40,7),auVar102[3]);
  auVar84._9_6_ = 0;
  auVar84._0_9_ = Var73;
  auVar74._1_10_ = SUB1510(auVar84 << 0x30,5);
  auVar74[0] = auVar102[2];
  auVar85._11_4_ = 0;
  auVar85._0_11_ = auVar74;
  auVar67[2] = auVar102[1];
  auVar67._0_2_ = auVar102._0_2_;
  auVar67._3_12_ = SUB1512(auVar85 << 0x20,3);
  auVar152._0_2_ = auVar102._0_2_ & 0xff;
  auVar152._2_13_ = auVar67._2_13_;
  auVar152[0xf] = 0;
  auVar197._0_2_ = CONCAT11(0,auVar102[8]);
  bVar202 = auVar102[9];
  auVar197[2] = bVar202;
  auVar197[3] = 0;
  bVar203 = auVar102[10];
  auVar197[4] = bVar203;
  auVar197[5] = 0;
  bVar204 = auVar102[0xb];
  auVar197[6] = bVar204;
  auVar197[7] = 0;
  bVar205 = auVar102[0xc];
  auVar197[8] = bVar205;
  auVar197[9] = 0;
  bVar206 = auVar102[0xd];
  auVar197[10] = bVar206;
  auVar197[0xb] = 0;
  bVar207 = auVar102[0xe];
  auVar197[0xc] = bVar207;
  auVar197[0xd] = 0;
  bVar208 = auVar102[0xf];
  auVar197[0xe] = bVar208;
  auVar197[0xf] = 0;
  auVar40[0xd] = 0;
  auVar40._0_13_ = auVar103._0_13_;
  auVar40[0xe] = auVar103[7];
  uVar46 = auVar40._13_2_;
  auVar47[0xc] = auVar103[6];
  auVar47._0_12_ = auVar103._0_12_;
  auVar47._13_2_ = uVar46;
  auVar52[0xb] = 0;
  auVar52._0_11_ = auVar103._0_11_;
  auVar52._12_3_ = auVar47._12_3_;
  auVar56[10] = auVar103[5];
  auVar56._0_10_ = auVar103._0_10_;
  auVar56._11_4_ = auVar52._11_4_;
  auVar60[9] = 0;
  auVar60._0_9_ = auVar103._0_9_;
  auVar60._10_5_ = auVar56._10_5_;
  auVar64[8] = auVar103[4];
  auVar64._0_8_ = auVar103._0_8_;
  auVar64._9_6_ = auVar60._9_6_;
  auVar75._7_8_ = 0;
  auVar75._0_7_ = auVar64._8_7_;
  Var76 = CONCAT81(SUB158(auVar75 << 0x40,7),auVar103[3]);
  auVar86._9_6_ = 0;
  auVar86._0_9_ = Var76;
  auVar77._1_10_ = SUB1510(auVar86 << 0x30,5);
  auVar77[0] = auVar103[2];
  auVar87._11_4_ = 0;
  auVar87._0_11_ = auVar77;
  auVar78._1_12_ = SUB1512(auVar87 << 0x20,3);
  auVar78[0] = auVar103[1];
  auVar102._0_2_ = CONCAT11(0,auVar103[0]);
  auVar102._2_13_ = auVar78;
  auVar102[0xf] = 0;
  auVar107._0_2_ = CONCAT11(0,auVar103[8]);
  bVar108 = auVar103[9];
  auVar107[2] = bVar108;
  auVar107[3] = 0;
  bVar109 = auVar103[10];
  auVar107[4] = bVar109;
  auVar107[5] = 0;
  bVar110 = auVar103[0xb];
  auVar107[6] = bVar110;
  auVar107[7] = 0;
  bVar111 = auVar103[0xc];
  auVar107[8] = bVar111;
  auVar107[9] = 0;
  bVar112 = auVar103[0xd];
  auVar107[10] = bVar112;
  auVar107[0xb] = 0;
  bVar113 = auVar103[0xe];
  auVar107[0xc] = bVar113;
  auVar107[0xd] = 0;
  bVar114 = auVar103[0xf];
  auVar107[0xe] = bVar114;
  auVar107[0xf] = 0;
  auVar41[0xd] = 0;
  auVar41._0_13_ = auVar104._0_13_;
  auVar41[0xe] = auVar104[7];
  uVar48 = auVar41._13_2_;
  auVar49[0xc] = auVar104[6];
  auVar49._0_12_ = auVar104._0_12_;
  auVar49._13_2_ = uVar48;
  auVar53[0xb] = 0;
  auVar53._0_11_ = auVar104._0_11_;
  auVar53._12_3_ = auVar49._12_3_;
  auVar57[10] = auVar104[5];
  auVar57._0_10_ = auVar104._0_10_;
  auVar57._11_4_ = auVar53._11_4_;
  auVar61[9] = 0;
  auVar61._0_9_ = auVar104._0_9_;
  auVar61._10_5_ = auVar57._10_5_;
  auVar65[8] = auVar104[4];
  auVar65._0_8_ = auVar104._0_8_;
  auVar65._9_6_ = auVar61._9_6_;
  auVar79._7_8_ = 0;
  auVar79._0_7_ = auVar65._8_7_;
  Var80 = CONCAT81(SUB158(auVar79 << 0x40,7),auVar104[3]);
  auVar88._9_6_ = 0;
  auVar88._0_9_ = Var80;
  auVar81._1_10_ = SUB1510(auVar88 << 0x30,5);
  auVar81[0] = auVar104[2];
  auVar89._11_4_ = 0;
  auVar89._0_11_ = auVar81;
  auVar68[2] = auVar104[1];
  auVar68._0_2_ = auVar104._0_2_;
  auVar68._3_12_ = SUB1512(auVar89 << 0x20,3);
  auVar136._0_2_ = auVar104._0_2_ & 0xff;
  auVar136._2_13_ = auVar68._2_13_;
  auVar136[0xf] = 0;
  auVar115._0_2_ = CONCAT11(0,auVar104[8]);
  bVar116 = auVar104[9];
  auVar115[2] = bVar116;
  auVar115[3] = 0;
  bVar117 = auVar104[10];
  auVar115[4] = bVar117;
  auVar115[5] = 0;
  bVar118 = auVar104[0xb];
  auVar115[6] = bVar118;
  auVar115[7] = 0;
  bVar119 = auVar104[0xc];
  auVar115[8] = bVar119;
  auVar115[9] = 0;
  bVar120 = auVar104[0xd];
  auVar115[10] = bVar120;
  auVar115[0xb] = 0;
  bVar121 = auVar104[0xe];
  auVar115[0xc] = bVar121;
  auVar115[0xd] = 0;
  bVar122 = auVar104[0xf];
  auVar115[0xe] = bVar122;
  auVar115[0xf] = 0;
  auVar125 = pshuflw(ZEXT116(above[-1]),ZEXT116(above[-1]),0);
  uVar124 = auVar125._0_4_;
  sVar162 = auVar125._0_2_;
  sVar163 = auVar125._2_2_;
  auVar126._0_2_ = auVar143._0_2_ - sVar162;
  auVar126._2_2_ = auVar66._2_2_ - sVar163;
  auVar126._4_2_ = auVar71._0_2_ - sVar162;
  sVar130 = (short)Var70;
  auVar126._6_2_ = sVar130 - sVar163;
  auVar126._8_2_ = auVar62._8_2_ - sVar162;
  auVar126._10_2_ = auVar54._10_2_ - sVar163;
  auVar126._12_2_ = auVar43._12_2_ - sVar162;
  auVar126._14_2_ = (uVar42 >> 8) - sVar163;
  auVar173 = pabsw(in_XMM10,auVar126);
  auVar164._0_2_ = auVar152._0_2_ - sVar162;
  auVar164._2_2_ = auVar67._2_2_ - sVar163;
  auVar164._4_2_ = auVar74._0_2_ - sVar162;
  sVar172 = (short)Var73;
  auVar164._6_2_ = sVar172 - sVar163;
  auVar164._8_2_ = auVar63._8_2_ - sVar162;
  auVar164._10_2_ = auVar55._10_2_ - sVar163;
  auVar164._12_2_ = auVar45._12_2_ - sVar162;
  auVar164._14_2_ = (uVar44 >> 8) - sVar163;
  auVar165 = pabsw(auVar164,auVar164);
  auVar103._0_2_ = auVar102._0_2_ - sVar162;
  auVar103._2_2_ = auVar78._0_2_ - sVar163;
  auVar103._4_2_ = auVar77._0_2_ - sVar162;
  sVar106 = (short)Var76;
  auVar103._6_2_ = sVar106 - sVar163;
  auVar103._8_2_ = auVar64._8_2_ - sVar162;
  auVar103._10_2_ = auVar56._10_2_ - sVar163;
  auVar103._12_2_ = auVar47._12_2_ - sVar162;
  auVar103._14_2_ = (uVar46 >> 8) - sVar163;
  auVar104 = pabsw(auVar103,auVar103);
  auVar137._0_2_ = auVar136._0_2_ - sVar162;
  auVar137._2_2_ = auVar68._2_2_ - sVar163;
  auVar137._4_2_ = auVar81._0_2_ - sVar162;
  sVar142 = (short)Var80;
  auVar137._6_2_ = sVar142 - sVar163;
  auVar137._8_2_ = auVar65._8_2_ - sVar162;
  auVar137._10_2_ = auVar57._10_2_ - sVar163;
  auVar137._12_2_ = auVar49._12_2_ - sVar162;
  auVar137._14_2_ = (uVar48 >> 8) - sVar163;
  auVar105 = pabsw(auVar104,auVar137);
  lVar91 = 0;
  auVar125 = auVar165;
  do {
    auVar90 = *(undefined1 (*) [16])(left + lVar91 * 0x10);
    iVar92 = 0x10;
    auVar189 = _DAT_004d48a0;
    do {
      auVar177 = pshufb(auVar90,auVar189);
      sVar176 = auVar177._0_2_;
      sVar178 = auVar177._2_2_;
      sVar179 = auVar177._4_2_;
      sVar180 = auVar177._6_2_;
      sVar181 = auVar177._8_2_;
      sVar182 = auVar177._10_2_;
      sVar183 = auVar177._12_2_;
      sVar184 = auVar177._14_2_;
      auVar138._0_2_ = (auVar126._0_2_ + sVar176) - auVar143._0_2_;
      auVar138._2_2_ = (auVar126._2_2_ + sVar178) - auVar66._2_2_;
      auVar138._4_2_ = (auVar126._4_2_ + sVar179) - auVar71._0_2_;
      auVar138._6_2_ = (auVar126._6_2_ + sVar180) - sVar130;
      auVar138._8_2_ = (auVar126._8_2_ + sVar181) - auVar62._8_2_;
      auVar138._10_2_ = (auVar126._10_2_ + sVar182) - auVar54._10_2_;
      auVar138._12_2_ = (auVar126._12_2_ + sVar183) - auVar43._12_2_;
      auVar138._14_2_ = (auVar126._14_2_ + sVar184) - (uVar42 >> 8);
      auVar166 = pabsw(auVar125,auVar138);
      auVar175._0_2_ = (auVar126._0_2_ + sVar176) - sVar162;
      auVar175._2_2_ = (auVar126._2_2_ + sVar178) - sVar163;
      auVar175._4_2_ = (auVar126._4_2_ + sVar179) - sVar162;
      auVar175._6_2_ = (auVar126._6_2_ + sVar180) - sVar163;
      auVar175._8_2_ = (auVar126._8_2_ + sVar181) - sVar162;
      auVar175._10_2_ = (auVar126._10_2_ + sVar182) - sVar163;
      auVar175._12_2_ = (auVar126._12_2_ + sVar183) - sVar162;
      auVar175._14_2_ = (auVar126._14_2_ + sVar184) - sVar163;
      auVar125 = pabsw(auVar175,auVar175);
      auVar139._0_2_ = -(ushort)(auVar166._0_2_ < auVar173._0_2_);
      auVar139._2_2_ = -(ushort)(auVar166._2_2_ < auVar173._2_2_);
      auVar139._4_2_ = -(ushort)(auVar166._4_2_ < auVar173._4_2_);
      auVar139._6_2_ = -(ushort)(auVar166._6_2_ < auVar173._6_2_);
      auVar139._8_2_ = -(ushort)(auVar166._8_2_ < auVar173._8_2_);
      auVar139._10_2_ = -(ushort)(auVar166._10_2_ < auVar173._10_2_);
      auVar139._12_2_ = -(ushort)(auVar166._12_2_ < auVar173._12_2_);
      auVar139._14_2_ = -(ushort)(auVar166._14_2_ < auVar173._14_2_);
      auVar174._0_2_ = -(ushort)(auVar125._0_2_ < auVar173._0_2_);
      auVar174._2_2_ = -(ushort)(auVar125._2_2_ < auVar173._2_2_);
      auVar174._4_2_ = -(ushort)(auVar125._4_2_ < auVar173._4_2_);
      auVar174._6_2_ = -(ushort)(auVar125._6_2_ < auVar173._6_2_);
      auVar174._8_2_ = -(ushort)(auVar125._8_2_ < auVar173._8_2_);
      auVar174._10_2_ = -(ushort)(auVar125._10_2_ < auVar173._10_2_);
      auVar174._12_2_ = -(ushort)(auVar125._12_2_ < auVar173._12_2_);
      auVar174._14_2_ = -(ushort)(auVar125._14_2_ < auVar173._14_2_);
      auVar167._0_2_ = -(ushort)(auVar125._0_2_ < auVar166._0_2_);
      auVar167._2_2_ = -(ushort)(auVar125._2_2_ < auVar166._2_2_);
      auVar167._4_2_ = -(ushort)(auVar125._4_2_ < auVar166._4_2_);
      auVar167._6_2_ = -(ushort)(auVar125._6_2_ < auVar166._6_2_);
      auVar167._8_2_ = -(ushort)(auVar125._8_2_ < auVar166._8_2_);
      auVar167._10_2_ = -(ushort)(auVar125._10_2_ < auVar166._10_2_);
      auVar167._12_2_ = -(ushort)(auVar125._12_2_ < auVar166._12_2_);
      auVar167._14_2_ = -(ushort)(auVar125._14_2_ < auVar166._14_2_);
      auVar166._4_2_ = sVar162;
      auVar166._0_4_ = uVar124;
      auVar166._6_2_ = sVar163;
      auVar166._8_2_ = sVar162;
      auVar166._10_2_ = sVar163;
      auVar166._12_2_ = sVar162;
      auVar166._14_2_ = sVar163;
      auVar140._0_2_ = sVar176 - sVar162;
      auVar140._2_2_ = sVar178 - sVar163;
      auVar140._4_2_ = sVar179 - sVar162;
      auVar140._6_2_ = sVar180 - sVar163;
      auVar140._8_2_ = sVar181 - sVar162;
      auVar140._10_2_ = sVar182 - sVar163;
      auVar140._12_2_ = sVar183 - sVar162;
      auVar140._14_2_ = sVar184 - sVar163;
      auVar187._0_2_ = auVar94._0_2_ - sVar162;
      auVar187._2_2_ = (ushort)bVar95 - sVar163;
      auVar187._4_2_ = (ushort)bVar96 - sVar162;
      auVar187._6_2_ = (ushort)bVar97 - sVar163;
      auVar187._8_2_ = (ushort)bVar98 - sVar162;
      auVar187._10_2_ = (ushort)bVar99 - sVar163;
      auVar187._12_2_ = (ushort)bVar100 - sVar162;
      auVar187._14_2_ = (ushort)bVar101 - sVar163;
      auVar185 = pabsw(in_XMM12,auVar187);
      auVar125 = pabsw(auVar187,auVar140);
      auVar144._0_2_ = (auVar140._0_2_ + auVar94._0_2_) - sVar162;
      auVar144._2_2_ = (auVar140._2_2_ + (ushort)bVar95) - sVar163;
      auVar144._4_2_ = (auVar140._4_2_ + (ushort)bVar96) - sVar162;
      auVar144._6_2_ = (auVar140._6_2_ + (ushort)bVar97) - sVar163;
      auVar144._8_2_ = (auVar140._8_2_ + (ushort)bVar98) - sVar162;
      auVar144._10_2_ = (auVar140._10_2_ + (ushort)bVar99) - sVar163;
      auVar144._12_2_ = (auVar140._12_2_ + (ushort)bVar100) - sVar162;
      auVar144._14_2_ = (auVar140._14_2_ + (ushort)bVar101) - sVar163;
      auVar145 = pabsw(auVar144,auVar144);
      sVar123 = auVar125._0_2_;
      auVar190._0_2_ = -(ushort)(sVar123 < auVar185._0_2_);
      sVar128 = auVar125._2_2_;
      auVar190._2_2_ = -(ushort)(sVar128 < auVar185._2_2_);
      sVar129 = auVar125._4_2_;
      auVar190._4_2_ = -(ushort)(sVar129 < auVar185._4_2_);
      sVar131 = auVar125._6_2_;
      auVar190._6_2_ = -(ushort)(sVar131 < auVar185._6_2_);
      sVar132 = auVar125._8_2_;
      auVar190._8_2_ = -(ushort)(sVar132 < auVar185._8_2_);
      sVar133 = auVar125._10_2_;
      auVar190._10_2_ = -(ushort)(sVar133 < auVar185._10_2_);
      sVar134 = auVar125._12_2_;
      auVar190._12_2_ = -(ushort)(sVar134 < auVar185._12_2_);
      sVar135 = auVar125._14_2_;
      auVar190._14_2_ = -(ushort)(sVar135 < auVar185._14_2_);
      auVar186._0_2_ = -(ushort)(auVar145._0_2_ < auVar185._0_2_);
      auVar186._2_2_ = -(ushort)(auVar145._2_2_ < auVar185._2_2_);
      auVar186._4_2_ = -(ushort)(auVar145._4_2_ < auVar185._4_2_);
      auVar186._6_2_ = -(ushort)(auVar145._6_2_ < auVar185._6_2_);
      auVar186._8_2_ = -(ushort)(auVar145._8_2_ < auVar185._8_2_);
      auVar186._10_2_ = -(ushort)(auVar145._10_2_ < auVar185._10_2_);
      auVar186._12_2_ = -(ushort)(auVar145._12_2_ < auVar185._12_2_);
      auVar186._14_2_ = -(ushort)(auVar145._14_2_ < auVar185._14_2_);
      auVar191._0_2_ = -(ushort)(auVar145._0_2_ < sVar123);
      auVar191._2_2_ = -(ushort)(auVar145._2_2_ < sVar128);
      auVar191._4_2_ = -(ushort)(auVar145._4_2_ < sVar129);
      auVar191._6_2_ = -(ushort)(auVar145._6_2_ < sVar131);
      auVar191._8_2_ = -(ushort)(auVar145._8_2_ < sVar132);
      auVar191._10_2_ = -(ushort)(auVar145._10_2_ < sVar133);
      auVar191._12_2_ = -(ushort)(auVar145._12_2_ < sVar134);
      auVar191._14_2_ = -(ushort)(auVar145._14_2_ < sVar135);
      auVar145._4_2_ = sVar162;
      auVar145._0_4_ = uVar124;
      auVar145._6_2_ = sVar163;
      auVar145._8_2_ = sVar162;
      auVar145._10_2_ = sVar163;
      auVar145._12_2_ = sVar162;
      auVar145._14_2_ = sVar163;
      auVar175 = ~(auVar174 | auVar139) & auVar177 |
                 (~auVar167 & auVar143 | auVar166 & auVar167) & (auVar174 | auVar139);
      auVar187 = ~(auVar186 | auVar190) & auVar177 |
                 (~auVar191 & auVar94 | auVar145 & auVar191) & (auVar186 | auVar190);
      sVar1 = auVar175._0_2_;
      sVar3 = auVar175._2_2_;
      sVar6 = auVar175._4_2_;
      sVar8 = auVar175._6_2_;
      sVar10 = auVar175._8_2_;
      sVar12 = auVar175._10_2_;
      sVar14 = auVar175._12_2_;
      sVar16 = auVar175._14_2_;
      sVar18 = auVar187._0_2_;
      sVar20 = auVar187._2_2_;
      sVar22 = auVar187._4_2_;
      sVar24 = auVar187._6_2_;
      sVar26 = auVar187._8_2_;
      sVar28 = auVar187._10_2_;
      sVar30 = auVar187._12_2_;
      sVar32 = auVar187._14_2_;
      auVar168._0_2_ = (auVar164._0_2_ + sVar176) - auVar152._0_2_;
      auVar168._2_2_ = (auVar164._2_2_ + sVar178) - auVar67._2_2_;
      auVar168._4_2_ = (auVar164._4_2_ + sVar179) - auVar74._0_2_;
      auVar168._6_2_ = (auVar164._6_2_ + sVar180) - sVar172;
      auVar168._8_2_ = (auVar164._8_2_ + sVar181) - auVar63._8_2_;
      auVar168._10_2_ = (auVar164._10_2_ + sVar182) - auVar55._10_2_;
      auVar168._12_2_ = (auVar164._12_2_ + sVar183) - auVar45._12_2_;
      auVar168._14_2_ = (auVar164._14_2_ + sVar184) - (uVar44 >> 8);
      auVar166 = pabsw(auVar168,auVar168);
      auVar146._0_2_ = (auVar164._0_2_ + sVar176) - sVar162;
      auVar146._2_2_ = (auVar164._2_2_ + sVar178) - sVar163;
      auVar146._4_2_ = (auVar164._4_2_ + sVar179) - sVar162;
      auVar146._6_2_ = (auVar164._6_2_ + sVar180) - sVar163;
      auVar146._8_2_ = (auVar164._8_2_ + sVar181) - sVar162;
      auVar146._10_2_ = (auVar164._10_2_ + sVar182) - sVar163;
      auVar146._12_2_ = (auVar164._12_2_ + sVar183) - sVar162;
      auVar146._14_2_ = (auVar164._14_2_ + sVar184) - sVar163;
      auVar125 = pabsw(auVar146,auVar146);
      local_98 = auVar165._0_2_;
      sStack_96 = auVar165._2_2_;
      sStack_94 = auVar165._4_2_;
      sStack_92 = auVar165._6_2_;
      sStack_90 = auVar165._8_2_;
      sStack_8e = auVar165._10_2_;
      sStack_8c = auVar165._12_2_;
      sStack_8a = auVar165._14_2_;
      auVar192._0_2_ = -(ushort)(auVar166._0_2_ < local_98);
      auVar192._2_2_ = -(ushort)(auVar166._2_2_ < sStack_96);
      auVar192._4_2_ = -(ushort)(auVar166._4_2_ < sStack_94);
      auVar192._6_2_ = -(ushort)(auVar166._6_2_ < sStack_92);
      auVar192._8_2_ = -(ushort)(auVar166._8_2_ < sStack_90);
      auVar192._10_2_ = -(ushort)(auVar166._10_2_ < sStack_8e);
      auVar192._12_2_ = -(ushort)(auVar166._12_2_ < sStack_8c);
      auVar192._14_2_ = -(ushort)(auVar166._14_2_ < sStack_8a);
      auVar188._0_2_ = -(ushort)(auVar125._0_2_ < local_98);
      auVar188._2_2_ = -(ushort)(auVar125._2_2_ < sStack_96);
      auVar188._4_2_ = -(ushort)(auVar125._4_2_ < sStack_94);
      auVar188._6_2_ = -(ushort)(auVar125._6_2_ < sStack_92);
      auVar188._8_2_ = -(ushort)(auVar125._8_2_ < sStack_90);
      auVar188._10_2_ = -(ushort)(auVar125._10_2_ < sStack_8e);
      auVar188._12_2_ = -(ushort)(auVar125._12_2_ < sStack_8c);
      auVar188._14_2_ = -(ushort)(auVar125._14_2_ < sStack_8a);
      auVar169._0_2_ = -(ushort)(auVar125._0_2_ < auVar166._0_2_);
      auVar169._2_2_ = -(ushort)(auVar125._2_2_ < auVar166._2_2_);
      auVar169._4_2_ = -(ushort)(auVar125._4_2_ < auVar166._4_2_);
      auVar169._6_2_ = -(ushort)(auVar125._6_2_ < auVar166._6_2_);
      auVar169._8_2_ = -(ushort)(auVar125._8_2_ < auVar166._8_2_);
      auVar169._10_2_ = -(ushort)(auVar125._10_2_ < auVar166._10_2_);
      auVar169._12_2_ = -(ushort)(auVar125._12_2_ < auVar166._12_2_);
      auVar169._14_2_ = -(ushort)(auVar125._14_2_ < auVar166._14_2_);
      auVar185._4_2_ = sVar162;
      auVar185._0_4_ = uVar124;
      auVar185._6_2_ = sVar163;
      auVar185._8_2_ = sVar162;
      auVar185._10_2_ = sVar163;
      auVar185._12_2_ = sVar162;
      auVar185._14_2_ = sVar163;
      auVar193._0_2_ = auVar197._0_2_ - sVar162;
      auVar193._2_2_ = (ushort)bVar202 - sVar163;
      auVar193._4_2_ = (ushort)bVar203 - sVar162;
      auVar193._6_2_ = (ushort)bVar204 - sVar163;
      auVar193._8_2_ = (ushort)bVar205 - sVar162;
      auVar193._10_2_ = (ushort)bVar206 - sVar163;
      auVar193._12_2_ = (ushort)bVar207 - sVar162;
      auVar193._14_2_ = (ushort)bVar208 - sVar163;
      auVar166 = pabsw(auVar193,auVar193);
      auVar147._0_2_ = (auVar140._0_2_ + auVar197._0_2_) - sVar162;
      auVar147._2_2_ = (auVar140._2_2_ + (ushort)bVar202) - sVar163;
      auVar147._4_2_ = (auVar140._4_2_ + (ushort)bVar203) - sVar162;
      auVar147._6_2_ = (auVar140._6_2_ + (ushort)bVar204) - sVar163;
      auVar147._8_2_ = (auVar140._8_2_ + (ushort)bVar205) - sVar162;
      auVar147._10_2_ = (auVar140._10_2_ + (ushort)bVar206) - sVar163;
      auVar147._12_2_ = (auVar140._12_2_ + (ushort)bVar207) - sVar162;
      auVar147._14_2_ = (auVar140._14_2_ + (ushort)bVar208) - sVar163;
      auVar125 = pabsw(auVar147,auVar147);
      auVar153._0_2_ = -(ushort)(sVar123 < auVar166._0_2_);
      auVar153._2_2_ = -(ushort)(sVar128 < auVar166._2_2_);
      auVar153._4_2_ = -(ushort)(sVar129 < auVar166._4_2_);
      auVar153._6_2_ = -(ushort)(sVar131 < auVar166._6_2_);
      auVar153._8_2_ = -(ushort)(sVar132 < auVar166._8_2_);
      auVar153._10_2_ = -(ushort)(sVar133 < auVar166._10_2_);
      auVar153._12_2_ = -(ushort)(sVar134 < auVar166._12_2_);
      auVar153._14_2_ = -(ushort)(sVar135 < auVar166._14_2_);
      auVar194._0_2_ = -(ushort)(auVar125._0_2_ < auVar166._0_2_);
      auVar194._2_2_ = -(ushort)(auVar125._2_2_ < auVar166._2_2_);
      auVar194._4_2_ = -(ushort)(auVar125._4_2_ < auVar166._4_2_);
      auVar194._6_2_ = -(ushort)(auVar125._6_2_ < auVar166._6_2_);
      auVar194._8_2_ = -(ushort)(auVar125._8_2_ < auVar166._8_2_);
      auVar194._10_2_ = -(ushort)(auVar125._10_2_ < auVar166._10_2_);
      auVar194._12_2_ = -(ushort)(auVar125._12_2_ < auVar166._12_2_);
      auVar194._14_2_ = -(ushort)(auVar125._14_2_ < auVar166._14_2_);
      auVar154._0_2_ = -(ushort)(auVar125._0_2_ < sVar123);
      auVar154._2_2_ = -(ushort)(auVar125._2_2_ < sVar128);
      auVar154._4_2_ = -(ushort)(auVar125._4_2_ < sVar129);
      auVar154._6_2_ = -(ushort)(auVar125._6_2_ < sVar131);
      auVar154._8_2_ = -(ushort)(auVar125._8_2_ < sVar132);
      auVar154._10_2_ = -(ushort)(auVar125._10_2_ < sVar133);
      auVar154._12_2_ = -(ushort)(auVar125._12_2_ < sVar134);
      auVar154._14_2_ = -(ushort)(auVar125._14_2_ < sVar135);
      auVar196._4_2_ = sVar162;
      auVar196._0_4_ = uVar124;
      auVar196._6_2_ = sVar163;
      auVar196._8_2_ = sVar162;
      auVar196._10_2_ = sVar163;
      auVar196._12_2_ = sVar162;
      auVar196._14_2_ = sVar163;
      auVar125 = (~auVar169 & auVar152 | auVar185 & auVar169) & (auVar188 | auVar192);
      auVar166 = ~(auVar188 | auVar192) & auVar177 | auVar125;
      auVar145 = ~(auVar194 | auVar153) & auVar177 |
                 (~auVar154 & auVar197 | auVar196 & auVar154) & (auVar194 | auVar153);
      sVar2 = auVar166._0_2_;
      sVar4 = auVar166._2_2_;
      in_XMM12[1] = (0 < sVar4) * (sVar4 < 0x100) * auVar166[2] - (0xff < sVar4);
      in_XMM12[0] = (0 < sVar2) * (sVar2 < 0x100) * auVar166[0] - (0xff < sVar2);
      sVar2 = auVar166._4_2_;
      in_XMM12[2] = (0 < sVar2) * (sVar2 < 0x100) * auVar166[4] - (0xff < sVar2);
      sVar2 = auVar166._6_2_;
      in_XMM12[3] = (0 < sVar2) * (sVar2 < 0x100) * auVar166[6] - (0xff < sVar2);
      sVar2 = auVar166._8_2_;
      in_XMM12[4] = (0 < sVar2) * (sVar2 < 0x100) * auVar166[8] - (0xff < sVar2);
      sVar2 = auVar166._10_2_;
      in_XMM12[5] = (0 < sVar2) * (sVar2 < 0x100) * auVar166[10] - (0xff < sVar2);
      sVar2 = auVar166._12_2_;
      in_XMM12[6] = (0 < sVar2) * (sVar2 < 0x100) * auVar166[0xc] - (0xff < sVar2);
      sVar2 = auVar166._14_2_;
      in_XMM12[7] = (0 < sVar2) * (sVar2 < 0x100) * auVar166[0xe] - (0xff < sVar2);
      sVar2 = auVar145._0_2_;
      in_XMM12[8] = (0 < sVar2) * (sVar2 < 0x100) * auVar145[0] - (0xff < sVar2);
      sVar2 = auVar145._2_2_;
      in_XMM12[9] = (0 < sVar2) * (sVar2 < 0x100) * auVar145[2] - (0xff < sVar2);
      sVar2 = auVar145._4_2_;
      in_XMM12[10] = (0 < sVar2) * (sVar2 < 0x100) * auVar145[4] - (0xff < sVar2);
      sVar2 = auVar145._6_2_;
      in_XMM12[0xb] = (0 < sVar2) * (sVar2 < 0x100) * auVar145[6] - (0xff < sVar2);
      sVar2 = auVar145._8_2_;
      in_XMM12[0xc] = (0 < sVar2) * (sVar2 < 0x100) * auVar145[8] - (0xff < sVar2);
      sVar2 = auVar145._10_2_;
      in_XMM12[0xd] = (0 < sVar2) * (sVar2 < 0x100) * auVar145[10] - (0xff < sVar2);
      sVar2 = auVar145._12_2_;
      in_XMM12[0xe] = (0 < sVar2) * (sVar2 < 0x100) * auVar145[0xc] - (0xff < sVar2);
      sVar2 = auVar145._14_2_;
      in_XMM12[0xf] = (0 < sVar2) * (sVar2 < 0x100) * auVar145[0xe] - (0xff < sVar2);
      auVar155._0_2_ = (auVar103._0_2_ + sVar176) - auVar102._0_2_;
      auVar155._2_2_ = (auVar103._2_2_ + sVar178) - auVar78._0_2_;
      auVar155._4_2_ = (auVar103._4_2_ + sVar179) - auVar77._0_2_;
      auVar155._6_2_ = (auVar103._6_2_ + sVar180) - sVar106;
      auVar155._8_2_ = (auVar103._8_2_ + sVar181) - auVar64._8_2_;
      auVar155._10_2_ = (auVar103._10_2_ + sVar182) - auVar56._10_2_;
      auVar155._12_2_ = (auVar103._12_2_ + sVar183) - auVar47._12_2_;
      auVar155._14_2_ = (auVar103._14_2_ + sVar184) - (uVar46 >> 8);
      auVar166 = pabsw(auVar125,auVar155);
      auVar148._0_2_ = (auVar103._0_2_ + sVar176) - sVar162;
      auVar148._2_2_ = (auVar103._2_2_ + sVar178) - sVar163;
      auVar148._4_2_ = (auVar103._4_2_ + sVar179) - sVar162;
      auVar148._6_2_ = (auVar103._6_2_ + sVar180) - sVar163;
      auVar148._8_2_ = (auVar103._8_2_ + sVar181) - sVar162;
      auVar148._10_2_ = (auVar103._10_2_ + sVar182) - sVar163;
      auVar148._12_2_ = (auVar103._12_2_ + sVar183) - sVar162;
      auVar148._14_2_ = (auVar103._14_2_ + sVar184) - sVar163;
      auVar125 = pabsw(auVar148,auVar148);
      local_b8 = auVar104._0_2_;
      sStack_b6 = auVar104._2_2_;
      sStack_b4 = auVar104._4_2_;
      sStack_b2 = auVar104._6_2_;
      sStack_b0 = auVar104._8_2_;
      sStack_ae = auVar104._10_2_;
      sStack_ac = auVar104._12_2_;
      sStack_aa = auVar104._14_2_;
      auVar156._0_2_ = -(ushort)(auVar166._0_2_ < local_b8);
      auVar156._2_2_ = -(ushort)(auVar166._2_2_ < sStack_b6);
      auVar156._4_2_ = -(ushort)(auVar166._4_2_ < sStack_b4);
      auVar156._6_2_ = -(ushort)(auVar166._6_2_ < sStack_b2);
      auVar156._8_2_ = -(ushort)(auVar166._8_2_ < sStack_b0);
      auVar156._10_2_ = -(ushort)(auVar166._10_2_ < sStack_ae);
      auVar156._12_2_ = -(ushort)(auVar166._12_2_ < sStack_ac);
      auVar156._14_2_ = -(ushort)(auVar166._14_2_ < sStack_aa);
      auVar195._0_2_ = -(ushort)(auVar125._0_2_ < local_b8);
      auVar195._2_2_ = -(ushort)(auVar125._2_2_ < sStack_b6);
      auVar195._4_2_ = -(ushort)(auVar125._4_2_ < sStack_b4);
      auVar195._6_2_ = -(ushort)(auVar125._6_2_ < sStack_b2);
      auVar195._8_2_ = -(ushort)(auVar125._8_2_ < sStack_b0);
      auVar195._10_2_ = -(ushort)(auVar125._10_2_ < sStack_ae);
      auVar195._12_2_ = -(ushort)(auVar125._12_2_ < sStack_ac);
      auVar195._14_2_ = -(ushort)(auVar125._14_2_ < sStack_aa);
      auVar170._0_2_ = -(ushort)(auVar125._0_2_ < auVar166._0_2_);
      auVar170._2_2_ = -(ushort)(auVar125._2_2_ < auVar166._2_2_);
      auVar170._4_2_ = -(ushort)(auVar125._4_2_ < auVar166._4_2_);
      auVar170._6_2_ = -(ushort)(auVar125._6_2_ < auVar166._6_2_);
      auVar170._8_2_ = -(ushort)(auVar125._8_2_ < auVar166._8_2_);
      auVar170._10_2_ = -(ushort)(auVar125._10_2_ < auVar166._10_2_);
      auVar170._12_2_ = -(ushort)(auVar125._12_2_ < auVar166._12_2_);
      auVar170._14_2_ = -(ushort)(auVar125._14_2_ < auVar166._14_2_);
      auVar34._4_2_ = sVar162;
      auVar34._0_4_ = uVar124;
      auVar34._6_2_ = sVar163;
      auVar34._8_2_ = sVar162;
      auVar34._10_2_ = sVar163;
      auVar34._12_2_ = sVar162;
      auVar34._14_2_ = sVar163;
      auVar157._0_2_ = auVar107._0_2_ - sVar162;
      auVar157._2_2_ = (ushort)bVar108 - sVar163;
      auVar157._4_2_ = (ushort)bVar109 - sVar162;
      auVar157._6_2_ = (ushort)bVar110 - sVar163;
      auVar157._8_2_ = (ushort)bVar111 - sVar162;
      auVar157._10_2_ = (ushort)bVar112 - sVar163;
      auVar157._12_2_ = (ushort)bVar113 - sVar162;
      auVar157._14_2_ = (ushort)bVar114 - sVar163;
      auVar166 = pabsw(auVar157,auVar157);
      auVar149._0_2_ = (auVar140._0_2_ + auVar107._0_2_) - sVar162;
      auVar149._2_2_ = (auVar140._2_2_ + (ushort)bVar108) - sVar163;
      auVar149._4_2_ = (auVar140._4_2_ + (ushort)bVar109) - sVar162;
      auVar149._6_2_ = (auVar140._6_2_ + (ushort)bVar110) - sVar163;
      auVar149._8_2_ = (auVar140._8_2_ + (ushort)bVar111) - sVar162;
      auVar149._10_2_ = (auVar140._10_2_ + (ushort)bVar112) - sVar163;
      auVar149._12_2_ = (auVar140._12_2_ + (ushort)bVar113) - sVar162;
      auVar149._14_2_ = (auVar140._14_2_ + (ushort)bVar114) - sVar163;
      auVar125 = pabsw(auVar149,auVar149);
      auVar198._0_2_ = -(ushort)(sVar123 < auVar166._0_2_);
      auVar198._2_2_ = -(ushort)(sVar128 < auVar166._2_2_);
      auVar198._4_2_ = -(ushort)(sVar129 < auVar166._4_2_);
      auVar198._6_2_ = -(ushort)(sVar131 < auVar166._6_2_);
      auVar198._8_2_ = -(ushort)(sVar132 < auVar166._8_2_);
      auVar198._10_2_ = -(ushort)(sVar133 < auVar166._10_2_);
      auVar198._12_2_ = -(ushort)(sVar134 < auVar166._12_2_);
      auVar198._14_2_ = -(ushort)(sVar135 < auVar166._14_2_);
      auVar158._0_2_ = -(ushort)(auVar125._0_2_ < auVar166._0_2_);
      auVar158._2_2_ = -(ushort)(auVar125._2_2_ < auVar166._2_2_);
      auVar158._4_2_ = -(ushort)(auVar125._4_2_ < auVar166._4_2_);
      auVar158._6_2_ = -(ushort)(auVar125._6_2_ < auVar166._6_2_);
      auVar158._8_2_ = -(ushort)(auVar125._8_2_ < auVar166._8_2_);
      auVar158._10_2_ = -(ushort)(auVar125._10_2_ < auVar166._10_2_);
      auVar158._12_2_ = -(ushort)(auVar125._12_2_ < auVar166._12_2_);
      auVar158._14_2_ = -(ushort)(auVar125._14_2_ < auVar166._14_2_);
      auVar199._0_2_ = -(ushort)(auVar125._0_2_ < sVar123);
      auVar199._2_2_ = -(ushort)(auVar125._2_2_ < sVar128);
      auVar199._4_2_ = -(ushort)(auVar125._4_2_ < sVar129);
      auVar199._6_2_ = -(ushort)(auVar125._6_2_ < sVar131);
      auVar199._8_2_ = -(ushort)(auVar125._8_2_ < sVar132);
      auVar199._10_2_ = -(ushort)(auVar125._10_2_ < sVar133);
      auVar199._12_2_ = -(ushort)(auVar125._12_2_ < sVar134);
      auVar199._14_2_ = -(ushort)(auVar125._14_2_ < sVar135);
      auVar35._4_2_ = sVar162;
      auVar35._0_4_ = uVar124;
      auVar35._6_2_ = sVar163;
      auVar35._8_2_ = sVar162;
      auVar35._10_2_ = sVar163;
      auVar35._12_2_ = sVar162;
      auVar35._14_2_ = sVar163;
      auVar196 = ~(auVar195 | auVar156) & auVar177 |
                 (~auVar170 & auVar102 | auVar34 & auVar170) & (auVar195 | auVar156);
      auVar166 = ~(auVar158 | auVar198) & auVar177 |
                 (~auVar199 & auVar107 | auVar35 & auVar199) & (auVar158 | auVar198);
      sVar2 = auVar196._0_2_;
      sVar5 = auVar196._2_2_;
      sVar7 = auVar196._4_2_;
      sVar9 = auVar196._6_2_;
      sVar11 = auVar196._8_2_;
      sVar13 = auVar196._10_2_;
      sVar15 = auVar196._12_2_;
      sVar17 = auVar196._14_2_;
      sVar19 = auVar166._0_2_;
      sVar21 = auVar166._2_2_;
      sVar23 = auVar166._4_2_;
      sVar25 = auVar166._6_2_;
      sVar27 = auVar166._8_2_;
      sVar29 = auVar166._10_2_;
      sVar31 = auVar166._12_2_;
      sVar33 = auVar166._14_2_;
      auVar150._0_2_ = (auVar137._0_2_ + sVar176) - auVar136._0_2_;
      auVar150._2_2_ = (auVar137._2_2_ + sVar178) - auVar68._2_2_;
      auVar150._4_2_ = (auVar137._4_2_ + sVar179) - auVar81._0_2_;
      auVar150._6_2_ = (auVar137._6_2_ + sVar180) - sVar142;
      auVar150._8_2_ = (auVar137._8_2_ + sVar181) - auVar65._8_2_;
      auVar150._10_2_ = (auVar137._10_2_ + sVar182) - auVar57._10_2_;
      auVar150._12_2_ = (auVar137._12_2_ + sVar183) - auVar49._12_2_;
      auVar150._14_2_ = (auVar137._14_2_ + sVar184) - (uVar48 >> 8);
      auVar125 = pabsw(auVar150,auVar150);
      auVar159._0_2_ = (auVar137._0_2_ + sVar176) - sVar162;
      auVar159._2_2_ = (auVar137._2_2_ + sVar178) - sVar163;
      auVar159._4_2_ = (auVar137._4_2_ + sVar179) - sVar162;
      auVar159._6_2_ = (auVar137._6_2_ + sVar180) - sVar163;
      auVar159._8_2_ = (auVar137._8_2_ + sVar181) - sVar162;
      auVar159._10_2_ = (auVar137._10_2_ + sVar182) - sVar163;
      auVar159._12_2_ = (auVar137._12_2_ + sVar183) - sVar162;
      auVar159._14_2_ = (auVar137._14_2_ + sVar184) - sVar163;
      auVar145 = pabsw(auVar159,auVar159);
      local_d8 = auVar105._0_2_;
      sStack_d6 = auVar105._2_2_;
      sStack_d4 = auVar105._4_2_;
      sStack_d2 = auVar105._6_2_;
      sStack_d0 = auVar105._8_2_;
      sStack_ce = auVar105._10_2_;
      sStack_cc = auVar105._12_2_;
      sStack_ca = auVar105._14_2_;
      auVar200._0_2_ = -(ushort)(auVar125._0_2_ < local_d8);
      auVar200._2_2_ = -(ushort)(auVar125._2_2_ < sStack_d6);
      auVar200._4_2_ = -(ushort)(auVar125._4_2_ < sStack_d4);
      auVar200._6_2_ = -(ushort)(auVar125._6_2_ < sStack_d2);
      auVar200._8_2_ = -(ushort)(auVar125._8_2_ < sStack_d0);
      auVar200._10_2_ = -(ushort)(auVar125._10_2_ < sStack_ce);
      auVar200._12_2_ = -(ushort)(auVar125._12_2_ < sStack_cc);
      auVar200._14_2_ = -(ushort)(auVar125._14_2_ < sStack_ca);
      auVar171._0_2_ = -(ushort)(auVar145._0_2_ < local_d8);
      auVar171._2_2_ = -(ushort)(auVar145._2_2_ < sStack_d6);
      auVar171._4_2_ = -(ushort)(auVar145._4_2_ < sStack_d4);
      auVar171._6_2_ = -(ushort)(auVar145._6_2_ < sStack_d2);
      auVar171._8_2_ = -(ushort)(auVar145._8_2_ < sStack_d0);
      auVar171._10_2_ = -(ushort)(auVar145._10_2_ < sStack_ce);
      auVar171._12_2_ = -(ushort)(auVar145._12_2_ < sStack_cc);
      auVar171._14_2_ = -(ushort)(auVar145._14_2_ < sStack_ca);
      auVar151._0_2_ = -(ushort)(auVar145._0_2_ < auVar125._0_2_);
      auVar151._2_2_ = -(ushort)(auVar145._2_2_ < auVar125._2_2_);
      auVar151._4_2_ = -(ushort)(auVar145._4_2_ < auVar125._4_2_);
      auVar151._6_2_ = -(ushort)(auVar145._6_2_ < auVar125._6_2_);
      auVar151._8_2_ = -(ushort)(auVar145._8_2_ < auVar125._8_2_);
      auVar151._10_2_ = -(ushort)(auVar145._10_2_ < auVar125._10_2_);
      auVar151._12_2_ = -(ushort)(auVar145._12_2_ < auVar125._12_2_);
      auVar151._14_2_ = -(ushort)(auVar145._14_2_ < auVar125._14_2_);
      auVar36._4_2_ = sVar162;
      auVar36._0_4_ = uVar124;
      auVar36._6_2_ = sVar163;
      auVar36._8_2_ = sVar162;
      auVar36._10_2_ = sVar163;
      auVar36._12_2_ = sVar162;
      auVar36._14_2_ = sVar163;
      auVar160._0_2_ = auVar115._0_2_ - sVar162;
      auVar160._2_2_ = (ushort)bVar116 - sVar163;
      auVar160._4_2_ = (ushort)bVar117 - sVar162;
      auVar160._6_2_ = (ushort)bVar118 - sVar163;
      auVar160._8_2_ = (ushort)bVar119 - sVar162;
      auVar160._10_2_ = (ushort)bVar120 - sVar163;
      auVar160._12_2_ = (ushort)bVar121 - sVar162;
      auVar160._14_2_ = (ushort)bVar122 - sVar163;
      auVar145 = pabsw(auVar160,auVar160);
      auVar141._0_2_ = (auVar140._0_2_ + auVar115._0_2_) - sVar162;
      auVar141._2_2_ = (auVar140._2_2_ + (ushort)bVar116) - sVar163;
      auVar141._4_2_ = (auVar140._4_2_ + (ushort)bVar117) - sVar162;
      auVar141._6_2_ = (auVar140._6_2_ + (ushort)bVar118) - sVar163;
      auVar141._8_2_ = (auVar140._8_2_ + (ushort)bVar119) - sVar162;
      auVar141._10_2_ = (auVar140._10_2_ + (ushort)bVar120) - sVar163;
      auVar141._12_2_ = (auVar140._12_2_ + (ushort)bVar121) - sVar162;
      auVar141._14_2_ = (auVar140._14_2_ + (ushort)bVar122) - sVar163;
      auVar125 = pabsw(auVar141,auVar141);
      auVar201._0_2_ = -(ushort)(sVar123 < auVar145._0_2_);
      auVar201._2_2_ = -(ushort)(sVar128 < auVar145._2_2_);
      auVar201._4_2_ = -(ushort)(sVar129 < auVar145._4_2_);
      auVar201._6_2_ = -(ushort)(sVar131 < auVar145._6_2_);
      auVar201._8_2_ = -(ushort)(sVar132 < auVar145._8_2_);
      auVar201._10_2_ = -(ushort)(sVar133 < auVar145._10_2_);
      auVar201._12_2_ = -(ushort)(sVar134 < auVar145._12_2_);
      auVar201._14_2_ = -(ushort)(sVar135 < auVar145._14_2_);
      auVar161._0_2_ = -(ushort)(auVar125._0_2_ < auVar145._0_2_);
      auVar161._2_2_ = -(ushort)(auVar125._2_2_ < auVar145._2_2_);
      auVar161._4_2_ = -(ushort)(auVar125._4_2_ < auVar145._4_2_);
      auVar161._6_2_ = -(ushort)(auVar125._6_2_ < auVar145._6_2_);
      auVar161._8_2_ = -(ushort)(auVar125._8_2_ < auVar145._8_2_);
      auVar161._10_2_ = -(ushort)(auVar125._10_2_ < auVar145._10_2_);
      auVar161._12_2_ = -(ushort)(auVar125._12_2_ < auVar145._12_2_);
      auVar161._14_2_ = -(ushort)(auVar125._14_2_ < auVar145._14_2_);
      auVar127._0_2_ = -(ushort)(auVar125._0_2_ < sVar123);
      auVar127._2_2_ = -(ushort)(auVar125._2_2_ < sVar128);
      auVar127._4_2_ = -(ushort)(auVar125._4_2_ < sVar129);
      auVar127._6_2_ = -(ushort)(auVar125._6_2_ < sVar131);
      auVar127._8_2_ = -(ushort)(auVar125._8_2_ < sVar132);
      auVar127._10_2_ = -(ushort)(auVar125._10_2_ < sVar133);
      auVar127._12_2_ = -(ushort)(auVar125._12_2_ < sVar134);
      auVar127._14_2_ = -(ushort)(auVar125._14_2_ < sVar135);
      auVar37._4_2_ = sVar162;
      auVar37._0_4_ = uVar124;
      auVar37._6_2_ = sVar163;
      auVar37._8_2_ = sVar162;
      auVar37._10_2_ = sVar163;
      auVar37._12_2_ = sVar162;
      auVar37._14_2_ = sVar163;
      auVar185 = ~(auVar171 | auVar200) & auVar177 |
                 (~auVar151 & auVar136 | auVar36 & auVar151) & (auVar171 | auVar200);
      auVar145 = ~(auVar161 | auVar201) & auVar177 |
                 (~auVar127 & auVar115 | auVar37 & auVar127) & (auVar161 | auVar201);
      sVar4 = auVar185._0_2_;
      sVar123 = auVar185._2_2_;
      auVar125[1] = (0 < sVar123) * (sVar123 < 0x100) * auVar185[2] - (0xff < sVar123);
      auVar125[0] = (0 < sVar4) * (sVar4 < 0x100) * auVar185[0] - (0xff < sVar4);
      sVar4 = auVar185._4_2_;
      auVar125[2] = (0 < sVar4) * (sVar4 < 0x100) * auVar185[4] - (0xff < sVar4);
      sVar4 = auVar185._6_2_;
      auVar125[3] = (0 < sVar4) * (sVar4 < 0x100) * auVar185[6] - (0xff < sVar4);
      sVar4 = auVar185._8_2_;
      auVar125[4] = (0 < sVar4) * (sVar4 < 0x100) * auVar185[8] - (0xff < sVar4);
      sVar4 = auVar185._10_2_;
      auVar125[5] = (0 < sVar4) * (sVar4 < 0x100) * auVar185[10] - (0xff < sVar4);
      sVar4 = auVar185._12_2_;
      auVar125[6] = (0 < sVar4) * (sVar4 < 0x100) * auVar185[0xc] - (0xff < sVar4);
      sVar4 = auVar185._14_2_;
      auVar125[7] = (0 < sVar4) * (sVar4 < 0x100) * auVar185[0xe] - (0xff < sVar4);
      sVar4 = auVar145._0_2_;
      auVar125[8] = (0 < sVar4) * (sVar4 < 0x100) * auVar145[0] - (0xff < sVar4);
      sVar4 = auVar145._2_2_;
      auVar125[9] = (0 < sVar4) * (sVar4 < 0x100) * auVar145[2] - (0xff < sVar4);
      sVar4 = auVar145._4_2_;
      auVar125[10] = (0 < sVar4) * (sVar4 < 0x100) * auVar145[4] - (0xff < sVar4);
      sVar4 = auVar145._6_2_;
      auVar125[0xb] = (0 < sVar4) * (sVar4 < 0x100) * auVar145[6] - (0xff < sVar4);
      sVar4 = auVar145._8_2_;
      auVar125[0xc] = (0 < sVar4) * (sVar4 < 0x100) * auVar145[8] - (0xff < sVar4);
      sVar4 = auVar145._10_2_;
      auVar125[0xd] = (0 < sVar4) * (sVar4 < 0x100) * auVar145[10] - (0xff < sVar4);
      sVar4 = auVar145._12_2_;
      auVar125[0xe] = (0 < sVar4) * (sVar4 < 0x100) * auVar145[0xc] - (0xff < sVar4);
      sVar4 = auVar145._14_2_;
      auVar125[0xf] = (0 < sVar4) * (sVar4 < 0x100) * auVar145[0xe] - (0xff < sVar4);
      *dst = (0 < sVar1) * (sVar1 < 0x100) * auVar175[0] - (0xff < sVar1);
      dst[1] = (0 < sVar3) * (sVar3 < 0x100) * auVar175[2] - (0xff < sVar3);
      dst[2] = (0 < sVar6) * (sVar6 < 0x100) * auVar175[4] - (0xff < sVar6);
      dst[3] = (0 < sVar8) * (sVar8 < 0x100) * auVar175[6] - (0xff < sVar8);
      dst[4] = (0 < sVar10) * (sVar10 < 0x100) * auVar175[8] - (0xff < sVar10);
      dst[5] = (0 < sVar12) * (sVar12 < 0x100) * auVar175[10] - (0xff < sVar12);
      dst[6] = (0 < sVar14) * (sVar14 < 0x100) * auVar175[0xc] - (0xff < sVar14);
      dst[7] = (0 < sVar16) * (sVar16 < 0x100) * auVar175[0xe] - (0xff < sVar16);
      dst[8] = (0 < sVar18) * (sVar18 < 0x100) * auVar187[0] - (0xff < sVar18);
      dst[9] = (0 < sVar20) * (sVar20 < 0x100) * auVar187[2] - (0xff < sVar20);
      dst[10] = (0 < sVar22) * (sVar22 < 0x100) * auVar187[4] - (0xff < sVar22);
      dst[0xb] = (0 < sVar24) * (sVar24 < 0x100) * auVar187[6] - (0xff < sVar24);
      dst[0xc] = (0 < sVar26) * (sVar26 < 0x100) * auVar187[8] - (0xff < sVar26);
      dst[0xd] = (0 < sVar28) * (sVar28 < 0x100) * auVar187[10] - (0xff < sVar28);
      dst[0xe] = (0 < sVar30) * (sVar30 < 0x100) * auVar187[0xc] - (0xff < sVar30);
      dst[0xf] = (0 < sVar32) * (sVar32 < 0x100) * auVar187[0xe] - (0xff < sVar32);
      *(undefined1 (*) [16])(dst + 0x10) = in_XMM12;
      dst[0x20] = (0 < sVar2) * (sVar2 < 0x100) * auVar196[0] - (0xff < sVar2);
      dst[0x21] = (0 < sVar5) * (sVar5 < 0x100) * auVar196[2] - (0xff < sVar5);
      dst[0x22] = (0 < sVar7) * (sVar7 < 0x100) * auVar196[4] - (0xff < sVar7);
      dst[0x23] = (0 < sVar9) * (sVar9 < 0x100) * auVar196[6] - (0xff < sVar9);
      dst[0x24] = (0 < sVar11) * (sVar11 < 0x100) * auVar196[8] - (0xff < sVar11);
      dst[0x25] = (0 < sVar13) * (sVar13 < 0x100) * auVar196[10] - (0xff < sVar13);
      dst[0x26] = (0 < sVar15) * (sVar15 < 0x100) * auVar196[0xc] - (0xff < sVar15);
      dst[0x27] = (0 < sVar17) * (sVar17 < 0x100) * auVar196[0xe] - (0xff < sVar17);
      dst[0x28] = (0 < sVar19) * (sVar19 < 0x100) * auVar166[0] - (0xff < sVar19);
      dst[0x29] = (0 < sVar21) * (sVar21 < 0x100) * auVar166[2] - (0xff < sVar21);
      dst[0x2a] = (0 < sVar23) * (sVar23 < 0x100) * auVar166[4] - (0xff < sVar23);
      dst[0x2b] = (0 < sVar25) * (sVar25 < 0x100) * auVar166[6] - (0xff < sVar25);
      dst[0x2c] = (0 < sVar27) * (sVar27 < 0x100) * auVar166[8] - (0xff < sVar27);
      dst[0x2d] = (0 < sVar29) * (sVar29 < 0x100) * auVar166[10] - (0xff < sVar29);
      dst[0x2e] = (0 < sVar31) * (sVar31 < 0x100) * auVar166[0xc] - (0xff < sVar31);
      dst[0x2f] = (0 < sVar33) * (sVar33 < 0x100) * auVar166[0xe] - (0xff < sVar33);
      *(undefined1 (*) [16])(dst + 0x30) = auVar125;
      dst = dst + stride;
      auVar177._0_2_ = auVar189._0_2_ + 1;
      auVar177._2_2_ = auVar189._2_2_ + 1;
      auVar177._4_2_ = auVar189._4_2_ + 1;
      auVar177._6_2_ = auVar189._6_2_ + 1;
      auVar177._8_2_ = auVar189._8_2_ + 1;
      auVar177._10_2_ = auVar189._10_2_ + 1;
      auVar177._12_2_ = auVar189._12_2_ + 1;
      auVar177._14_2_ = auVar189._14_2_ + 1;
      iVar92 = iVar92 + -1;
      auVar189 = auVar177;
    } while (iVar92 != 0);
    bVar93 = lVar91 == 0;
    lVar91 = lVar91 + 1;
  } while (bVar93);
  return;
}

Assistant:

void aom_paeth_predictor_64x32_ssse3(uint8_t *dst, ptrdiff_t stride,
                                     const uint8_t *above,
                                     const uint8_t *left) {
  const __m128i a = _mm_load_si128((const __m128i *)above);
  const __m128i b = _mm_load_si128((const __m128i *)(above + 16));
  const __m128i c = _mm_load_si128((const __m128i *)(above + 32));
  const __m128i d = _mm_load_si128((const __m128i *)(above + 48));
  const __m128i zero = _mm_setzero_si128();
  const __m128i al = _mm_unpacklo_epi8(a, zero);
  const __m128i ah = _mm_unpackhi_epi8(a, zero);
  const __m128i bl = _mm_unpacklo_epi8(b, zero);
  const __m128i bh = _mm_unpackhi_epi8(b, zero);
  const __m128i cl = _mm_unpacklo_epi8(c, zero);
  const __m128i ch = _mm_unpackhi_epi8(c, zero);
  const __m128i dl = _mm_unpacklo_epi8(d, zero);
  const __m128i dh = _mm_unpackhi_epi8(d, zero);

  const __m128i tl16 = _mm_set1_epi16((int16_t)above[-1]);
  const __m128i one = _mm_set1_epi16(1);
  __m128i l16;

  int i, j;
  for (j = 0; j < 2; ++j) {
    const __m128i l = _mm_load_si128((const __m128i *)(left + j * 16));
    __m128i rep = _mm_set1_epi16((short)0x8000);
    for (i = 0; i < 16; ++i) {
      l16 = _mm_shuffle_epi8(l, rep);
      const __m128i r0 = paeth_16x1_pred(&l16, &al, &ah, &tl16);
      const __m128i r1 = paeth_16x1_pred(&l16, &bl, &bh, &tl16);
      const __m128i r2 = paeth_16x1_pred(&l16, &cl, &ch, &tl16);
      const __m128i r3 = paeth_16x1_pred(&l16, &dl, &dh, &tl16);

      _mm_store_si128((__m128i *)dst, r0);
      _mm_store_si128((__m128i *)(dst + 16), r1);
      _mm_store_si128((__m128i *)(dst + 32), r2);
      _mm_store_si128((__m128i *)(dst + 48), r3);
      dst += stride;
      rep = _mm_add_epi16(rep, one);
    }
  }
}